

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

void __thiscall ArgsManager::LogArgs(ArgsManager *this)

{
  _Base_ptr p_Var1;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view source_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock25;
  string local_78;
  string local_58;
  undefined8 local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock25,&this->cs_args,"cs_args",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/common/args.cpp"
             ,0x356,false);
  for (p_Var1 = (this->m_settings).ro_config._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_settings).ro_config._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Config file arg:",(allocator<char> *)&local_78);
    logArgsPrefix(this,&local_58,(string *)(p_Var1 + 1),
                  (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<UniValue,_std::allocator<UniValue>_>_>_>_>
                   *)(p_Var1 + 2));
    std::__cxx11::string::~string((string *)&local_58);
  }
  for (p_Var1 = (this->m_settings).rw_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 !=
      &(this->m_settings).rw_settings._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    UniValue::write_abi_cxx11_((UniValue *)&local_58,(int)p_Var1 + 0x40,(void *)0x0,0);
    logging_function._M_str = "LogArgs";
    logging_function._M_len = 7;
    source_file._M_str =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/common/args.cpp";
    source_file._M_len = 0x58;
    LogPrintf_<std::__cxx11::string,std::__cxx11::string>
              (logging_function,source_file,0x35b,LEVELDB|QT|PRUNE|REINDEX|RPC|WALLETDB|TOR,
               (int)p_Var1 + 0x20,(char *)&local_58,in_stack_ffffffffffffff68,
               in_stack_ffffffffffffff70);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Command-line arg:",(allocator<char> *)&stack0xffffffffffffff77);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"",(allocator<char> *)&stack0xffffffffffffff76);
  logArgsPrefix(this,&local_58,&local_78,&(this->m_settings).command_line_options);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock25.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ArgsManager::LogArgs() const
{
    LOCK(cs_args);
    for (const auto& section : m_settings.ro_config) {
        logArgsPrefix("Config file arg:", section.first, section.second);
    }
    for (const auto& setting : m_settings.rw_settings) {
        LogPrintf("Setting file arg: %s = %s\n", setting.first, setting.second.write());
    }
    logArgsPrefix("Command-line arg:", "", m_settings.command_line_options);
}